

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_phsubsw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  int iVar1;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  iVar1 = satsw((int)(short)d->_w_MMXReg[0] - (int)(short)d->_w_MMXReg[1]);
  d->_w_MMXReg[0] = (uint16_t)iVar1;
  iVar1 = satsw((int)(short)d->_w_MMXReg[2] - (int)(short)d->_w_MMXReg[3]);
  d->_w_MMXReg[1] = (uint16_t)iVar1;
  iVar1 = satsw((int)(short)s->_w_MMXReg[0] - (int)(short)s->_w_MMXReg[1]);
  d->_w_MMXReg[2] = (uint16_t)iVar1;
  iVar1 = satsw((int)(short)s->_w_MMXReg[2] - (int)(short)s->_w_MMXReg[3]);
  d->_w_MMXReg[3] = (uint16_t)iVar1;
  return;
}

Assistant:

void glue(helper_phsubsw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    d->W(0) = satsw((int16_t)d->W(0) - (int16_t)d->W(1));
    d->W(1) = satsw((int16_t)d->W(2) - (int16_t)d->W(3));
    XMM_ONLY(d->W(2) = satsw((int16_t)d->W(4) - (int16_t)d->W(5)));
    XMM_ONLY(d->W(3) = satsw((int16_t)d->W(6) - (int16_t)d->W(7)));
    d->W((2 << SHIFT) + 0) = satsw((int16_t)s->W(0) - (int16_t)s->W(1));
    d->W((2 << SHIFT) + 1) = satsw((int16_t)s->W(2) - (int16_t)s->W(3));
    XMM_ONLY(d->W(6) = satsw((int16_t)s->W(4) - (int16_t)s->W(5)));
    XMM_ONLY(d->W(7) = satsw((int16_t)s->W(6) - (int16_t)s->W(7)));
}